

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

void __thiscall setup::message_entry::load(message_entry *this,istream *is,info *i)

{
  pointer plVar1;
  pointer plVar2;
  uint uVar3;
  uint32_t *puVar4;
  undefined1 local_1a0 [384];
  
  local_1a0._8_4_ = i->codepage;
  local_1a0._16_8_ = (bitset<256UL> *)0x0;
  local_1a0._0_8_ = this;
  util::operator>>(is,(encoded_string *)local_1a0);
  util::binary_string::load(is,&this->value);
  uVar3 = util::load<int,util::little_endian>(is);
  this->language = uVar3;
  if ((int)uVar3 < 0) {
    puVar4 = &i->codepage;
  }
  else {
    plVar1 = (i->languages).
             super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    plVar2 = (i->languages).
             super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)plVar2 - (long)plVar1) / 0x178) <= (ulong)uVar3) {
      if (plVar1 != plVar2) {
        local_1a0._0_4_ = 2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
        std::operator<<((ostream *)(local_1a0 + 8),"Language index out of bounds: ");
        logger::operator<<((logger *)local_1a0,&this->language);
        logger::~logger((logger *)local_1a0);
      }
      (this->value)._M_string_length = 0;
      *(this->value)._M_dataplus._M_p = '\0';
      return;
    }
    puVar4 = &plVar1[uVar3].codepage;
  }
  util::to_utf8(&this->value,*puVar4,(bitset<256UL> *)0x0);
  return;
}

Assistant:

void message_entry::load(std::istream & is, const info & i) {
	
	is >> util::encoded_string(name, i.codepage);
	is >> util::binary_string(value);
	
	language = util::load<boost::int32_t>(is);
	
	boost::uint32_t codepage;
	if(language < 0) {
		codepage = i.codepage;
	} else if(size_t(language) >= i.languages.size()) {
		if(!i.languages.empty()) {
			log_warning << "Language index out of bounds: " << language;
		}
		value.clear();
		return;
	} else {
		codepage = i.languages[size_t(language)].codepage;
	}
	
	util::to_utf8(value, codepage);
}